

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::Parser::_handle_indentation(Parser *this)

{
  uint uVar1;
  pfn_error p_Var2;
  ulong ahead;
  ulong uVar3;
  State *pSVar4;
  code *pcVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  bool bVar11;
  undefined1 uVar12;
  anon_unknown_0 *this_00;
  State *pSVar13;
  size_t sVar14;
  NodeData *pNVar15;
  State *pSVar16;
  char *pcVar17;
  char *extraout_RDX;
  char *pcVar18;
  csubstr s;
  ro_substr chars;
  csubstr fmt;
  csubstr cVar19;
  csubstr rem;
  char msg [31];
  char *pcStack_e8;
  size_t local_e0;
  char *pcStack_c0;
  size_t local_b8;
  char *pcStack_98;
  size_t local_90;
  char *pcStack_70;
  size_t local_68;
  char *pcStack_48;
  size_t local_40;
  csubstr remt;
  
  pSVar13 = this->m_state;
  if ((pSVar13->flags & 0x10) != 0) {
    builtin_strncpy(msg,"check failed: (has_none(FLOW))",0x1f);
    if ((((byte)s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
      pcVar5 = (code *)swi(3);
      uVar12 = (*pcVar5)();
      return (bool)uVar12;
    }
    p_Var2 = (this->m_stack).m_callbacks.m_error;
    cVar19 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_40 = cVar19.len;
    pcStack_48 = cVar19.str;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7952) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x7952) << 0x40,8);
    LVar6.name.str = pcStack_48;
    LVar6.name.len = local_40;
    (*p_Var2)(msg,0x1f,LVar6,(this->m_stack).m_callbacks.m_user_data);
    pSVar13 = this->m_state;
  }
  if ((pSVar13->line_contents).rem.str != (pSVar13->line_contents).full.str) {
    return false;
  }
  ahead = (pSVar13->line_contents).indentation;
  rem.str = (pSVar13->line_contents).rem.str;
  rem.len = (pSVar13->line_contents).rem.len;
  remt = basic_substring<const_char>::triml(&rem,' ');
  pcVar17 = (char *)remt.len;
  this_00 = (anon_unknown_0 *)remt.str;
  sVar14 = rem.len;
  if ((this_00 != (anon_unknown_0 *)0x0 && pcVar17 != (char *)0x0) &&
     (*this_00 != (anon_unknown_0)0x23)) {
    pSVar13 = this->m_state;
    uVar3 = pSVar13->indref;
    if (ahead == uVar3) {
      if (rem.len < ahead) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
          pcVar5 = (code *)swi(3);
          uVar12 = (*pcVar5)();
          return (bool)uVar12;
        }
        handle_error(0x1e5106,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)msg,rem.str + ahead,rem.len - ahead);
      if ((CONCAT17(msg[0xf],CONCAT16(msg[0xe],msg._8_6_)) == 0) || (*(char *)msg._0_8_ != '-')) {
        uVar1 = this->m_state->flags;
        if ((uVar1 & 4) == 0) {
          if (((uVar1 & 8) != 0) && (2 < (this->m_stack).m_size)) {
            if ((uVar1 >> 8 & 1) == 0) {
              if (-1 < (char)uVar1) goto LAB_001c8ec2;
              _append_val_null(this,rem.str);
            }
            _pop_level(this);
            return true;
          }
        }
        else if ((~uVar1 & 0x280) == 0) {
          _append_key_val_null(this,rem.str + (ahead - 1));
          this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
        }
      }
LAB_001c8ec2:
      _line_progressed(this,ahead);
      return ahead != 0;
    }
    if (uVar3 <= ahead) {
      pcVar18 = pcVar17;
      if (ahead <= uVar3) {
        builtin_strncpy(msg,"check failed: (ind > m_state->i",0x1f);
        if ((((byte)s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
          pcVar5 = (code *)swi(3);
          uVar12 = (*pcVar5)();
          return (bool)uVar12;
        }
        p_Var2 = (this->m_stack).m_callbacks.m_error;
        cVar19 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_e0 = cVar19.len;
        pcStack_e8 = cVar19.str;
        LVar8.super_LineCol.col = 0;
        LVar8.super_LineCol.offset = SUB168(ZEXT816(0x79dc) << 0x40,0);
        LVar8.super_LineCol.line = SUB168(ZEXT816(0x79dc) << 0x40,8);
        LVar8.name.str = pcStack_e8;
        LVar8.name.len = local_e0;
        (*p_Var2)(msg,0x26,LVar8,(this->m_stack).m_callbacks.m_user_data);
        pSVar13 = this->m_state;
        pcVar18 = extraout_RDX;
      }
      if ((~pSVar13->flags & 0x84U) == 0) {
        s.len = (size_t)pcVar18;
        s.str = pcVar17;
        bVar11 = anon_unknown_0::_is_scalar_next__rmap_val(this_00,s);
        if ((bVar11) &&
           (chars.len = 2, chars.str = ":?",
           sVar14 = basic_substring<const_char>::first_of(&remt,chars,0),
           sVar14 == 0xffffffffffffffff)) {
          return false;
        }
        this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
        _start_unk(this,false);
        _line_progressed(this,ahead);
        _save_indentation(this,0);
        return true;
      }
      if ((~pSVar13->flags & 0x88U) == 0) {
        return false;
      }
      bVar11 = is_debugger_attached();
      if ((bVar11) && (bVar11 = is_debugger_attached(), bVar11)) {
        pcVar5 = (code *)swi(3);
        uVar12 = (*pcVar5)();
        return (bool)uVar12;
      }
      cVar19.len = 0x42;
      cVar19.str = "ERROR: parse error - indentation should not increase at this point";
      _err<>(this,cVar19);
      return false;
    }
    uVar1 = pSVar13->flags;
    if ((char)uVar1 < '\0') {
      if ((uVar1 & 4) == 0) {
        if ((uVar1 & 8) != 0) {
          if ((uVar1 >> 9 & 1) != 0) {
            builtin_strncpy(msg,"check failed: (has_none(SSCL))",0x1f);
            if ((((byte)s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
              pcVar5 = (code *)swi(3);
              uVar12 = (*pcVar5)();
              return (bool)uVar12;
            }
            p_Var2 = (this->m_stack).m_callbacks.m_error;
            cVar19 = to_csubstr(
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               );
            local_90 = cVar19.len;
            pcStack_98 = cVar19.str;
            LVar7.super_LineCol.col = 0;
            LVar7.super_LineCol.offset = SUB168(ZEXT816(0x7996) << 0x40,0);
            LVar7.super_LineCol.line = SUB168(ZEXT816(0x7996) << 0x40,8);
            LVar7.name.str = pcStack_98;
            LVar7.name.len = local_90;
            (*p_Var2)(msg,0x1f,LVar7,(this->m_stack).m_callbacks.m_user_data);
          }
          if (rem.len < ahead) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
              pcVar5 = (code *)swi(3);
              uVar12 = (*pcVar5)();
              return (bool)uVar12;
            }
            handle_error(0x1e5106,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1533,"first >= 0 && first <= len");
          }
          basic_substring<const_char>::basic_substring
                    ((basic_substring<const_char> *)msg,rem.str + ahead,rem.len - ahead);
          _append_val_null(this,(char *)(msg._0_8_ + -1));
        }
      }
      else {
        if ((uVar1 >> 9 & 1) == 0) {
          builtin_strncpy(msg,"check failed: (has_all(SSCL))",0x1e);
          if ((((byte)s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
            pcVar5 = (code *)swi(3);
            uVar12 = (*pcVar5)();
            return (bool)uVar12;
          }
          p_Var2 = (this->m_stack).m_callbacks.m_error;
          cVar19 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_68 = cVar19.len;
          pcStack_70 = cVar19.str;
          LVar9.super_LineCol.col = 0;
          LVar9.super_LineCol.offset = SUB168(ZEXT816(0x7991) << 0x40,0);
          LVar9.super_LineCol.line = SUB168(ZEXT816(0x7991) << 0x40,8);
          LVar9.name.str = pcStack_70;
          LVar9.name.len = local_68;
          (*p_Var2)(msg,0x1e,LVar9,(this->m_stack).m_callbacks.m_user_data);
        }
        if (rem.len < ahead) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
            pcVar5 = (code *)swi(3);
            uVar12 = (*pcVar5)();
            return (bool)uVar12;
          }
          handle_error(0x1e5106,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)msg,rem.str + ahead,rem.len - ahead);
        _append_key_val_null(this,(char *)(msg._0_8_ + -1));
      }
    }
    pSVar4 = (this->m_stack).m_stack;
    pSVar13 = this->m_state;
    do {
      pSVar16 = pSVar13;
      pSVar13 = pSVar16 + -1;
      if (pSVar13 < pSVar4) {
        pSVar13 = (State *)0x0;
        goto LAB_001c9070;
      }
    } while (pSVar16[-1].indref != ahead);
    if ((((pSVar4 < pSVar13) && (pSVar16[-2].indref == ahead)) &&
        (pNVar15 = Tree::_p(this->m_tree,pSVar16[-1].node_id),
        ((pNVar15->m_type).type & SEQ) != NOTYPE)) &&
       ((pNVar15 = Tree::_p(this->m_tree,pSVar16[-2].node_id),
        ((pNVar15->m_type).type & MAP) != NOTYPE && (*this_00 != (anon_unknown_0)0x2d)))) {
      pSVar13 = pSVar16 + -2;
    }
    if ((this->m_state <= pSVar13) || (this->m_state->level <= pSVar13->level)) {
LAB_001c9070:
      bVar11 = is_debugger_attached();
      if ((bVar11) && (bVar11 = is_debugger_attached(), bVar11)) {
        pcVar5 = (code *)swi(3);
        uVar12 = (*pcVar5)();
        return (bool)uVar12;
      }
      fmt.len = 0x2a;
      fmt.str = "ERROR: parse error: incorrect indentation?";
      _err<>(this,fmt);
    }
    while (this->m_state != pSVar13) {
      _pop_level(this);
    }
    sVar14 = ahead;
    if (ahead != this->m_state->indref) {
      builtin_strncpy(msg,"check failed: (ind == m_state->",0x1f);
      if ((((byte)s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        pcVar5 = (code *)swi(3);
        uVar12 = (*pcVar5)();
        return (bool)uVar12;
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar19 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_b8 = cVar19.len;
      pcStack_c0 = cVar19.str;
      LVar10.super_LineCol.col = 0;
      LVar10.super_LineCol.offset = SUB168(ZEXT816(0x79d5) << 0x40,0);
      LVar10.super_LineCol.line = SUB168(ZEXT816(0x79d5) << 0x40,8);
      LVar10.name.str = pcStack_c0;
      LVar10.name.len = local_b8;
      (*p_Var2)(msg,0x27,LVar10,(this->m_stack).m_callbacks.m_user_data);
    }
  }
  _line_progressed(this,sVar14);
  return true;
}

Assistant:

bool Parser::_handle_indentation()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(FLOW));
    if( ! _at_line_begin())
        return false;

    size_t ind = m_state->line_contents.indentation;
    csubstr rem = m_state->line_contents.rem;
    /** @todo instead of trimming, we should use the indentation index from above */
    csubstr remt = rem.triml(' ');

    if(remt.empty() || remt.begins_with('#')) // this is a blank or comment line
    {
        _line_progressed(rem.size());
        return true;
    }

    _c4dbgpf("indentation? ind={} indref={}", ind, m_state->indref);
    if(ind == m_state->indref)
    {
        _c4dbgpf("same indentation: {}", ind);
        if(!rem.sub(ind).begins_with('-'))
        {
            _c4dbgp("does not begin with -");
            if(has_any(RMAP))
            {
                if(has_all(SSCL|RVAL))
                {
                    _c4dbgp("add with null val");
                    _append_key_val_null(rem.str + ind - 1);
                    addrem_flags(RKEY, RVAL);
                }
            }
            else if(has_any(RSEQ))
            {
                if(m_stack.size() > 2) // do not pop to root level
                {
                    if(has_any(RNXT))
                    {
                        _c4dbgp("end the indentless seq");
                        _pop_level();
                        return true;
                    }
                    else if(has_any(RVAL))
                    {
                        _c4dbgp("add with null val");
                        _append_val_null(rem.str);
                        _c4dbgp("end the indentless seq");
                        _pop_level();
                        return true;
                    }
                }
            }
        }
        _line_progressed(ind);
        return ind > 0;
    }
    else if(ind < m_state->indref)
    {
        _c4dbgpf("smaller indentation ({} < {})!!!", ind, m_state->indref);
        if(has_all(RVAL))
        {
            _c4dbgp("there was an empty val -- appending");
            if(has_all(RMAP))
            {
                _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(SSCL));
                _append_key_val_null(rem.sub(ind).str - 1);
            }
            else if(has_all(RSEQ))
            {
                _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(SSCL));
                _append_val_null(rem.sub(ind).str - 1);
            }
        }
        // search the stack frame to jump to based on its indentation
        State const* popto = nullptr;
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_stack.is_contiguous()); // this search relies on the stack being contiguous
        for(State const* s = m_state-1; s >= m_stack.begin(); --s)
        {
            _c4dbgpf("searching for state with indentation {}. curr={} (level={},node={})", ind, s->indref, s->level, s->node_id);
            if(s->indref == ind)
            {
                _c4dbgpf("gotit!!! level={} node={}", s->level, s->node_id);
                popto = s;
                // while it may be tempting to think we're done at this
                // point, we must still determine whether we're jumping to a
                // parent with the same indentation. Consider this case with
                // an indentless sequence:
                //
                // product:
                // - sku: BL394D
                //   quantity: 4
                //   description: Basketball
                //   price: 450.00
                // - sku: BL4438H
                //   quantity: 1
                //   description: Super Hoop
                //   price: 2392.00  # jumping one level here would be wrong.
                // tax: 1234.5       # we must jump two levels
                if(popto > m_stack.begin())
                {
                    auto parent = popto - 1;
                    if(parent->indref == popto->indref)
                    {
                        _c4dbgpf("the parent (level={},node={}) has the same indentation ({}). is this in an indentless sequence?", parent->level, parent->node_id, popto->indref);
                        _c4dbgpf("isseq(popto)={} ismap(parent)={}", m_tree->is_seq(popto->node_id), m_tree->is_map(parent->node_id));
                        if(m_tree->is_seq(popto->node_id) && m_tree->is_map(parent->node_id))
                        {
                            if( ! remt.begins_with('-'))
                            {
                                _c4dbgp("this is an indentless sequence");
                                popto = parent;
                            }
                            else
                            {
                                _c4dbgp("not an indentless sequence");
                            }
                        }
                    }
                }
                break;
            }
        }
        if(!popto || popto >= m_state || popto->level >= m_state->level)
        {
            _c4err("parse error: incorrect indentation?");
        }
        _c4dbgpf("popping {} levels: from level {} to level {}", m_state->level-popto->level, m_state->level, popto->level);
        while(m_state != popto)
        {
            _c4dbgpf("popping level {} (indentation={})", m_state->level, m_state->indref);
            _pop_level();
        }
        _RYML_CB_ASSERT(m_stack.m_callbacks, ind == m_state->indref);
        _line_progressed(ind);
        return true;
    }
    else
    {
        _c4dbgpf("larger indentation ({} > {})!!!", ind, m_state->indref);
        _RYML_CB_ASSERT(m_stack.m_callbacks, ind > m_state->indref);
        if(has_all(RMAP|RVAL))
        {
            if(_is_scalar_next__rmap_val(remt) && remt.first_of(":?") == npos)
            {
                _c4dbgpf("actually it seems a value: '{}'", remt);
            }
            else
            {
                addrem_flags(RKEY, RVAL);
                _start_unk();
                //_move_scalar_from_top();
                _line_progressed(ind);
                _save_indentation();
                return true;
            }
        }
        else if(has_all(RSEQ|RVAL))
        {
            // nothing to do here
        }
        else
        {
            _c4err("parse error - indentation should not increase at this point");
        }
    }

    return false;
}